

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::stp_wai
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_c [4];
  
  local_c[0] = OperationPerform;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_c);
    local_c[1] = 2;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_c + 1);
      local_c[2] = 2;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_c + 2);
        local_c[3] = 0x19;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_c + 3);
          return;
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void stp_wai(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(OperationPerform);			// Establishes the termination condition.
		target(CycleFetchPCThrowaway);		// IO.
		target(CycleFetchPCThrowaway);		// IO.
		target(CycleRepeatingNone);			// This will first check whether the STP/WAI exit
											// condition has occurred; if not then it'll issue
											// either a BusOperation::None or ::Ready and then
											// reschedule itself.
	}